

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1554.c
# Opt level: O1

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    uVar4 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1554.c"
                  ,0x32,iVar2,uVar4);
  }
  if (iVar2 == 0) {
    lVar5 = curl_share_init();
    if (lVar5 == 0) {
      curl_mfprintf(_stderr,"curl_share_init() failed\n");
      iVar2 = 0x7e;
    }
    else {
      curl_share_setopt(lVar5,1,5);
      iVar2 = 3;
      curl_share_setopt(lVar5,3,my_lock);
      curl_share_setopt(lVar5,4,my_unlock);
      do {
        lVar6 = curl_easy_init();
        if (lVar6 != 0) {
          curl_easy_setopt(lVar6,0x2712,URL);
          curl_easy_setopt(lVar6,0x2774,lVar5);
          iVar3 = curl_easy_perform(lVar6);
          uVar1 = _stderr;
          if (iVar3 != 0) {
            uVar4 = curl_easy_strerror(iVar3);
            curl_mfprintf(uVar1,"curl_easy_perform() failed: %s\n",uVar4);
          }
          curl_easy_cleanup(lVar6);
        }
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
      curl_share_cleanup(lVar5);
      iVar2 = 0;
    }
    curl_global_cleanup();
  }
  return iVar2;
}

Assistant:

int test(char *URL)
{
  CURLcode res = CURLE_OK;
  CURLSH *share;
  int i;

  global_init(CURL_GLOBAL_ALL);

  share = curl_share_init();
  if(!share) {
    fprintf(stderr, "curl_share_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_CONNECT);
  curl_share_setopt(share, CURLSHOPT_LOCKFUNC, my_lock);
  curl_share_setopt(share, CURLSHOPT_UNLOCKFUNC, my_unlock);

  /* Loop the transfer and cleanup the handle properly every lap. This will
     still reuse connections since the pool is in the shared object! */

  for(i = 0; i < 3; i++) {
    CURL *curl = curl_easy_init();
    if(curl) {
      curl_easy_setopt(curl, CURLOPT_URL, URL);

      /* use the share object */
      curl_easy_setopt(curl, CURLOPT_SHARE, share);

      /* Perform the request, res will get the return code */
      res = curl_easy_perform(curl);
      /* Check for errors */
      if(res != CURLE_OK)
        fprintf(stderr, "curl_easy_perform() failed: %s\n",
                curl_easy_strerror(res));

      /* always cleanup */
      curl_easy_cleanup(curl);
    }
  }

  curl_share_cleanup(share);
  curl_global_cleanup();

  return 0;
}